

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall TTD::MarkTable::MoveToNextAddress(MarkTable *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = this->m_iterPos;
  uVar1 = this->m_capcity;
  uVar4 = uVar2 + 1;
  if (uVar2 + 1 < uVar1) {
    uVar4 = uVar1;
  }
  do {
    uVar2 = uVar2 + 1;
    uVar3 = uVar4;
    if (uVar1 <= uVar2) break;
    uVar3 = uVar2;
  } while ((this->m_markArray[uVar2] & AllKindMask) == Clear);
  this->m_iterPos = uVar3;
  return;
}

Assistant:

void MoveToNextAddress()
        {
            this->m_iterPos++;

            while (this->m_iterPos < this->m_capcity)
            {
                MarkTableTag tag = this->m_markArray[this->m_iterPos];

                if ((tag & MarkTableTag::AllKindMask) != MarkTableTag::Clear)
                {
                    return;
                }

                this->m_iterPos++;
            }
        }